

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

GlobalVariable * __thiscall hdc::Parser::parse_global_variable(Parser *this)

{
  bool bVar1;
  reference pTVar2;
  GlobalVariable *this_00;
  Expression *local_50;
  Expression *expression;
  Type *type;
  Token name;
  Parser *this_local;
  
  name._40_8_ = this;
  Token::Token((Token *)&type);
  expression = (Expression *)0x0;
  local_50 = (Expression *)0x0;
  expect(this,TK_VAR);
  expect(this,TK_ID);
  pTVar2 = __gnu_cxx::
           __normal_iterator<hdc::Token_*,_std::vector<hdc::Token,_std::allocator<hdc::Token>_>_>::
           operator*(&this->matched);
  Token::operator=((Token *)&type,pTVar2);
  bVar1 = match(this,TK_COLON);
  if (bVar1) {
    expression = (Expression *)parse_type(this);
    bVar1 = match(this,TK_ASSIGNMENT);
    if (bVar1) {
      local_50 = parse_expression(this);
    }
  }
  else {
    expect(this,TK_ASSIGNMENT);
    local_50 = parse_expression(this);
  }
  expect(this,TK_NEWLINE);
  this_00 = (GlobalVariable *)operator_new(0x78);
  GlobalVariable::GlobalVariable(this_00,(Token *)&type,(Type *)expression,local_50);
  Token::~Token((Token *)&type);
  return this_00;
}

Assistant:

GlobalVariable* Parser::parse_global_variable() {
    Token name;
    Type* type = nullptr;
    Expression* expression = nullptr;

    expect(TK_VAR);
    expect(TK_ID);
    name = *matched;

    if (match(TK_COLON)) {
        type = parse_type();

        if (match(TK_ASSIGNMENT)) {
            expression = parse_expression();
        }
    } else {
        expect(TK_ASSIGNMENT);
        expression = parse_expression();
    }

    expect(TK_NEWLINE);
    return new GlobalVariable(name, type, expression);
}